

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

WebPChunk * ChunkDelete(WebPChunk *chunk)

{
  WebPChunk *pWVar1;
  
  pWVar1 = ChunkRelease(chunk);
  WebPSafeFree(chunk);
  return pWVar1;
}

Assistant:

WebPChunk* ChunkDelete(WebPChunk* const chunk) {
  WebPChunk* const next = ChunkRelease(chunk);
  WebPSafeFree(chunk);
  return next;
}